

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

double __thiscall
imrt::ApertureILS::localSearch
          (ApertureILS *this,pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam,Plan *P)

{
  int iVar1;
  ostream *poVar2;
  Plan *in_RSI;
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_> *in_RDI;
  double dVar3;
  bool sign;
  Station *s;
  int beamlet;
  bool best_improvement;
  bool search_a;
  double local_eval;
  double aux_eval;
  bool in_stack_0000009f;
  Plan *in_stack_000000a0;
  pointer in_stack_000000a8;
  bool in_stack_000000b7;
  Collimator *in_stack_000000b8;
  int in_stack_000000c4;
  ApertureILS *in_stack_000000c8;
  bool in_stack_0000011f;
  Plan *in_stack_00000120;
  _Base_ptr in_stack_00000128;
  bool in_stack_00000137;
  Station *in_stack_00000138;
  int in_stack_00000144;
  ApertureILS *in_stack_00000148;
  int *in_stack_ffffffffffffff88;
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
  *in_stack_ffffffffffffff90;
  Station *this_00;
  bool local_21;
  double local_18;
  
  this_00 = (Station *)&stack0x00000008;
  dVar3 = Plan::getEvaluation(in_RSI);
  if ((((ulong)in_RDI[1].
               super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
               ._M_impl._M_node.super__List_node_base._M_prev & 0x10000000000) == 0) ||
     (((ulong)in_RDI[1].
              super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev & 0x100000000) != 0)) {
    if ((((ulong)in_RDI[1].
                 super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                 ._M_impl._M_node.super__List_node_base._M_prev & 0x10000000000) == 0) &&
       (((ulong)in_RDI[1].
                super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev & 0x100000000) != 0)) {
      std::operator<<((ostream *)&std::cout,", ls intensity ");
      local_18 = improvementIntensity
                           (in_stack_00000148,in_stack_00000144,in_stack_00000138,in_stack_00000137,
                            (double)in_stack_00000128,in_stack_00000120,in_stack_0000011f);
      poVar2 = std::operator<<((ostream *)&std::cout,", found: ");
      std::ostream::operator<<(poVar2,local_18);
    }
    else if ((((ulong)in_RDI[1].
                      super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                      ._M_impl._M_node.super__List_node_base._M_prev & 0x10000000000) == 0) ||
            (((ulong)in_RDI[1].
                     super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                     ._M_impl._M_node.super__List_node_base._M_prev & 0x100000000) == 0)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ERROR: Search option not recognized!!!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      iVar1 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
      if (((ulong)this_00->_vptr_Station & 1) == 0) {
        local_21 = Station::anyClosed(this_00,iVar1);
      }
      else {
        local_21 = Station::anyOpen(this_00,iVar1);
      }
      iVar1 = rand();
      if (((double)iVar1 / 2147483647.0 <=
           (double)in_RDI[1].
                   super__List_base<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
                   ._M_impl._M_node._M_size) || (local_21 == false)) {
        std::operator<<((ostream *)&std::cout,", ls intensity");
        local_18 = improvementIntensity
                             (in_stack_00000148,in_stack_00000144,in_stack_00000138,
                              in_stack_00000137,(double)in_stack_00000128,in_stack_00000120,
                              in_stack_0000011f);
        poVar2 = std::operator<<((ostream *)&std::cout,", found: ");
        std::ostream::operator<<(poVar2,local_18);
      }
      else {
        std::operator<<((ostream *)&std::cout,", ls aperture");
        local_18 = improvementAperture(in_stack_000000c8,in_stack_000000c4,
                                       (Station *)in_stack_000000b8,in_stack_000000b7,
                                       (double)in_stack_000000a8,in_stack_000000a0,in_stack_0000009f
                                      );
        poVar2 = std::operator<<((ostream *)&std::cout,", found: ");
        std::ostream::operator<<(poVar2,local_18);
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,", ls aperture ");
    local_18 = improvementAperture(in_stack_000000c8,in_stack_000000c4,(Station *)in_stack_000000b8,
                                   in_stack_000000b7,(double)in_stack_000000a8,in_stack_000000a0,
                                   in_stack_0000009f);
    poVar2 = std::operator<<((ostream *)&std::cout,", found: ");
    std::ostream::operator<<(poVar2,local_18);
  }
  if (dVar3 <= local_18) {
    std::make_pair<imrt::Station*&,int&>((Station **)(in_RDI + 4),in_stack_ffffffffffffff88);
    std::__cxx11::
    list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::
    push_back(in_RDI,(value_type *)this_00);
  }
  else {
    std::__cxx11::
    list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::clear
              (in_stack_ffffffffffffff90);
  }
  return local_18;
}

Assistant:

double ApertureILS::localSearch(pair<bool, pair<Station*, int>> target_beam, Plan& P) {
  double aux_eval, local_eval=P.getEvaluation();
  bool search_a;
  bool best_improvement=ls_type;
  
  int beamlet = target_beam.second.second;
  Station* s = target_beam.second.first;
  bool sign = target_beam.first;

  if (search_aperture && !search_intensity) {
    cout << ", ls aperture ";
    aux_eval = improvementAperture(beamlet, *s, !sign, local_eval, P, best_improvement);
    cout << ", found: " << aux_eval;
  } else if (!search_aperture && search_intensity) {
    cout << ", ls intensity ";
    aux_eval = improvementIntensity(beamlet, *s, !sign, local_eval, P, best_improvement);
    cout << ", found: " << aux_eval;
  } else if (search_aperture && search_intensity) {
    if (!sign)
      search_a = s->anyClosed(beamlet);
    else 
      search_a = s->anyOpen(beamlet);

    if (((double) rand() / (RAND_MAX)) <= prob_intensity || !search_a) {
      cout << ", ls intensity";
      aux_eval = improvementIntensity(beamlet, *s,  !sign, local_eval, P, best_improvement);
      cout << ", found: " << aux_eval;
    } else {
      cout << ", ls aperture";
      aux_eval = improvementAperture(beamlet, *s, !sign, local_eval, P, best_improvement);
      cout << ", found: " << aux_eval;
    }
  } else {
    cout << "ERROR: Search option not recognized!!!" << endl;
    
  }
  if (local_eval>aux_eval) { 
    tabu.clear();
  }else{
    tabu.push_back(make_pair(s, beamlet));
  }
  return(aux_eval);
}